

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O3

void __thiscall
Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(BinaryTapePlayer *this,int input_clock_rate)

{
  TimedEventLoop::TimedEventLoop((TimedEventLoop *)this,(long)input_clock_rate);
  (this->super_TapePlayer).super_Source.observer_ = (Observer *)0x0;
  (this->super_TapePlayer).tape_.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_TapePlayer).tape_.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_TapePlayer).current_pulse_.length.length = 0;
  (this->super_TapePlayer).current_pulse_.length.clock_rate = 1;
  (this->super_TapePlayer).super_TimedEventLoop._vptr_TimedEventLoop =
       (_func_int **)&PTR_process_next_event_005a3ac0;
  (this->super_TapePlayer).super_Source._vptr_Source = (_func_int **)&DAT_005a3b00;
  this->delegate_ = (Delegate *)0x0;
  this->input_level_ = false;
  this->motor_is_running_ = false;
  this->observer_ = (Observer *)0x0;
  return;
}

Assistant:

BinaryTapePlayer::BinaryTapePlayer(int input_clock_rate) :
	TapePlayer(input_clock_rate)
{}